

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

Trigger * sqlite3TriggerList(Parse *pParse,Table *pTab)

{
  byte bVar1;
  byte bVar2;
  Schema *pSVar3;
  Schema *pSVar4;
  Trigger *pTVar5;
  Trigger *pTVar6;
  HashElem *pHVar7;
  long lVar8;
  
  pSVar3 = pParse->db->aDb[1].pSchema;
  pTVar6 = pTab->pTrigger;
  pHVar7 = (pSVar3->trigHash).first;
  if (pHVar7 == (HashElem *)0x0) {
    return pTVar6;
  }
  pSVar4 = pTab->pSchema;
LAB_001895ee:
  pTVar5 = (Trigger *)pHVar7->data;
  if ((pTVar5->pTabSchema == pSVar4) && (pTVar5->table != (char *)0x0)) {
    lVar8 = 0;
    do {
      bVar1 = pTVar5->table[lVar8];
      bVar2 = pTab->zName[lVar8];
      if (bVar1 == bVar2) {
        if ((ulong)bVar1 == 0) goto LAB_00189656;
      }
      else if (""[bVar1] != ""[bVar2]) goto LAB_00189656;
      lVar8 = lVar8 + 1;
    } while( true );
  }
  goto LAB_001895fb;
LAB_00189656:
  if ((bVar1 != bVar2) || ((pTVar5->pTabSchema == pSVar3 && (pTVar5->bReturning == '\0')))) {
LAB_001895fb:
    if (pTVar5->op != 0x97) goto LAB_00189618;
    pTVar5->table = pTab->zName;
    pTVar5->pTabSchema = pSVar4;
  }
  pTVar5->pNext = pTVar6;
  pTVar6 = pTVar5;
LAB_00189618:
  pHVar7 = pHVar7->next;
  if (pHVar7 == (HashElem *)0x0) {
    return pTVar6;
  }
  goto LAB_001895ee;
}

Assistant:

SQLITE_PRIVATE Trigger *sqlite3TriggerList(Parse *pParse, Table *pTab){
  Schema *pTmpSchema;       /* Schema of the pTab table */
  Trigger *pList;           /* List of triggers to return */
  HashElem *p;              /* Loop variable for TEMP triggers */

  assert( pParse->disableTriggers==0 );
  pTmpSchema = pParse->db->aDb[1].pSchema;
  p = sqliteHashFirst(&pTmpSchema->trigHash);
  pList = pTab->pTrigger;
  while( p ){
    Trigger *pTrig = (Trigger *)sqliteHashData(p);
    if( pTrig->pTabSchema==pTab->pSchema
     && pTrig->table
     && 0==sqlite3StrICmp(pTrig->table, pTab->zName)
     && (pTrig->pTabSchema!=pTmpSchema || pTrig->bReturning)
    ){
      pTrig->pNext = pList;
      pList = pTrig;
    }else if( pTrig->op==TK_RETURNING ){
#ifndef SQLITE_OMIT_VIRTUALTABLE
      assert( pParse->db->pVtabCtx==0 );
#endif
      assert( pParse->bReturning );
      assert( &(pParse->u1.pReturning->retTrig) == pTrig );
      pTrig->table = pTab->zName;
      pTrig->pTabSchema = pTab->pSchema;
      pTrig->pNext = pList;
      pList = pTrig;
    }
    p = sqliteHashNext(p);
  }
#if 0
  if( pList ){
    Trigger *pX;
    printf("Triggers for %s:", pTab->zName);
    for(pX=pList; pX; pX=pX->pNext){
      printf(" %s", pX->zName);
    }
    printf("\n");
    fflush(stdout);
  }
#endif
  return pList;
}